

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_is_error(int n)

{
  int iVar1;
  int *piVar2;
  
  if (n != 0) {
    if (-1 < n) {
      return 0;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (iVar1 == 4) {
      return 0;
    }
    if (iVar1 == 0xb) {
      return 0;
    }
    if (iVar1 == 0x73) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int mg_is_error(int n) {
#ifdef MG_CC3200
                                                                                                                            DBG(("n = %d, errno = %d", n, errno));
  if (n < 0) errno = n;
#endif
    return n == 0 || (n < 0 && errno != EINTR && errno != EINPROGRESS &&
                      errno != EAGAIN && errno != EWOULDBLOCK
#ifdef MG_CC3200
            && errno != SL_EALREADY
#endif
#ifdef _WIN32
                                                                                                                            && WSAGetLastError() != WSAEINTR &&
                    WSAGetLastError() != WSAEWOULDBLOCK
#endif
    );
}